

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this,Expression *value)

{
  ReturnValue *t;
  pool_ptr<soul::heart::Block> local_20;
  Expression *local_18;
  Expression *value_local;
  FunctionBuilder *this_local;
  
  local_18 = value;
  value_local = (Expression *)this;
  t = Module::allocate<soul::heart::ReturnValue,soul::heart::Expression&>
                ((this->super_BlockBuilder).module,value);
  pool_ptr<soul::heart::Block>::pool_ptr(&local_20,(void *)0x0);
  addTerminatorStatement(this,&t->super_Terminator,&local_20);
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_20);
  return;
}

Assistant:

void addReturn (heart::Expression& value)
    {
        addTerminatorStatement (module.allocate<heart::ReturnValue> (value), nullptr);
    }